

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O0

void __thiscall Database::deletePost(Database *this,int id)

{
  sqlite3 *db;
  int iVar1;
  char *pcVar2;
  DatabaseException *this_00;
  ostream *this_01;
  string local_d8 [39];
  allocator local_b1;
  string local_b0 [8];
  string error;
  int failure;
  __cxx11 local_80 [32];
  string local_60 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40 [8];
  string query;
  char *local_20;
  char *errorMsg;
  Database *pDStack_10;
  int id_local;
  Database *this_local;
  
  local_20 = (char *)0x0;
  errorMsg._4_4_ = id;
  pDStack_10 = this;
  std::__cxx11::to_string(local_80,id);
  std::operator+((char *)local_60,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "delete from posts where id =");
  std::operator+(local_40,(char *)local_60);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string((string *)local_80);
  db = this->database;
  pcVar2 = (char *)std::__cxx11::string::c_str();
  iVar1 = sqlite3_exec(db,pcVar2,(sqlite3_callback)0x0,(void *)0x0,&local_20);
  pcVar2 = local_20;
  if (iVar1 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b0,pcVar2,&local_b1);
    std::allocator<char>::~allocator((allocator<char> *)&local_b1);
    sqlite3_free(local_20);
    this_00 = (DatabaseException *)__cxa_allocate_exception(0x28);
    std::operator+((char *)local_d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "Error while deleting post: ");
    DatabaseException::DatabaseException(this_00,local_d8);
    __cxa_throw(this_00,&DatabaseException::typeinfo,DatabaseException::~DatabaseException);
  }
  this_01 = std::operator<<((ostream *)&std::cout,"Post deleted successfully");
  std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void Database::deletePost(int id)
{
	char* errorMsg = nullptr;
	std::string query = "delete from posts where id =" + std::to_string(id) + ";";

	int failure = sqlite3_exec(database, query.c_str(), nullptr, nullptr, &errorMsg);

	if(failure)
	{
		std::string error(errorMsg);
		sqlite3_free(errorMsg);
		throw DatabaseException("Error while deleting post: " + error);
	}
	else
	{
		std::cout << "Post deleted successfully" << std::endl;
	}
}